

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite.c
# Opt level: O1

_Bool has_test(TestSuite *suite,char *name)

{
  long lVar1;
  _Bool _Var2;
  int iVar3;
  ulong uVar4;
  anon_union_8_2_f5956e59_for_Runnable *paVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar6 = (ulong)suite->size;
  bVar7 = 0 < (long)uVar6;
  if (0 < (long)uVar6) {
    paVar5 = &suite->tests->Runnable;
    uVar4 = 1;
    do {
      if (((UnitTest *)(paVar5 + -2))->type == 0) {
        iVar3 = strcmp((char *)paVar5[-1].test,name);
        if (iVar3 == 0) {
          return bVar7;
        }
      }
      else {
        _Var2 = has_test(paVar5->suite,name);
        if (_Var2) {
          return bVar7;
        }
      }
      bVar7 = uVar4 < uVar6;
      paVar5 = paVar5 + 3;
      lVar1 = uVar4 + 1;
      uVar4 = uVar4 + 1;
    } while (lVar1 - uVar6 != 1);
  }
  return bVar7;
}

Assistant:

bool has_test(TestSuite *suite, const char *name) {
	int i;
	for (i = 0; i < suite->size; i++) {
        if (suite->tests[i].type == test_function) {
            if (strcmp(suite->tests[i].name, name) == 0) {
                return true;
            }
        } else if (has_test(suite->tests[i].Runnable.suite, name)) {
            return true;
        }
	}

	return false;
}